

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

size_t __thiscall
edition_unittest::TestOneof2_NestedMessage::ByteSizeLong(TestOneof2_NestedMessage *this)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  
  sVar2 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                    (&(this->field_0)._impl_.corge_int_,1,
                     &(this->field_0)._impl_._corge_int_cached_byte_size_);
  if ((undefined1  [40])((undefined1  [40])this->field_0 & (undefined1  [40])0x1) !=
      (undefined1  [40])0x0) {
    uVar3 = (this->field_0)._impl_.moo_int_ | 1;
    lVar1 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar2 = sVar2 + ((int)lVar1 * 9 + 0x89U >> 6);
  }
  sVar2 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar2,&(this->field_0)._impl_._cached_size_);
  return sVar2;
}

Assistant:

::size_t TestOneof2_NestedMessage::ByteSizeLong() const {
  const TestOneof2_NestedMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestOneof2.NestedMessage)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 corge_int = 2;
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_corge_int(), 1,
              this_._impl_._corge_int_cached_byte_size_);
    }
  }
   {
    // int64 moo_int = 1;
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int64SizePlusOne(
          this_._internal_moo_int());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}